

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O0

void x86_64_branch(dill_stream s,int op,int type,int src1,int src2,int label)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  undefined4 in_R9D;
  uint tmp_1;
  uint tmp;
  int rex;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int iVar1;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 uVar2;
  uint uVar3;
  int local_c;
  
  uVar3 = 0;
  if (((in_EDX == 6) || (in_EDX == 7)) || (in_EDX == 8)) {
    uVar3 = 8;
  }
  if (((in_EDX == 1) || (in_EDX == 3)) || ((in_EDX == 5 || (local_c = in_ESI, in_EDX == 7)))) {
    local_c = in_ESI + 6;
  }
  if (7 < in_ECX) {
    uVar3 = uVar3 | 1;
  }
  if (7 < in_R8D) {
    uVar3 = uVar3 | 4;
  }
  iVar1 = in_EDX;
  if (in_EDX == 10) {
    BYTE_OUT1R3((dill_stream)CONCAT44(in_R9D,uVar3),in_stack_ffffffffffffffdc,
                in_stack_ffffffffffffffd8,10,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  else if (in_EDX == 9) {
    BYTE_OUT3R((dill_stream)CONCAT44(in_R9D,uVar3),in_stack_ffffffffffffffdc,
               in_stack_ffffffffffffffd8,9,in_stack_ffffffffffffffd0);
  }
  else {
    BYTE_OUT2R((dill_stream)CONCAT44(in_R9D,uVar3),in_stack_ffffffffffffffdc,
               in_stack_ffffffffffffffd8,in_EDX);
  }
  dill_mark_branch_location((dill_stream_conflict)CONCAT44(in_R9D,uVar3),in_stack_ffffffffffffffdc);
  if ((in_EDX == 10) || (in_EDX == 9)) {
    uVar2 = 0;
    if (*(ulong *)(*(long *)(in_RDI + 8) + 0x10) <= *(ulong *)(*(long *)(in_RDI + 8) + 8)) {
      extend_dill_stream((dill_stream_conflict)CONCAT44(in_R9D,uVar3));
    }
    **(undefined1 **)(*(long *)(in_RDI + 8) + 8) = 0xf;
    *(uchar *)(*(long *)(*(long *)(in_RDI + 8) + 8) + 1) = fop_conds[local_c];
    *(undefined4 *)(*(long *)(*(long *)(in_RDI + 8) + 8) + 2) = uVar2;
    if (*(int *)(in_RDI + 0x18) != 0) {
      dump_cur_dill_insn((dill_stream_conflict)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    }
    *(long *)(*(long *)(in_RDI + 8) + 8) = *(long *)(*(long *)(in_RDI + 8) + 8) + 6;
  }
  else {
    uVar2 = 0;
    if (*(ulong *)(*(long *)(in_RDI + 8) + 0x10) <= *(ulong *)(*(long *)(in_RDI + 8) + 8)) {
      extend_dill_stream((dill_stream_conflict)CONCAT44(in_R9D,uVar3));
    }
    **(undefined1 **)(*(long *)(in_RDI + 8) + 8) = 0xf;
    *(uchar *)(*(long *)(*(long *)(in_RDI + 8) + 8) + 1) = op_conds[local_c];
    *(undefined4 *)(*(long *)(*(long *)(in_RDI + 8) + 8) + 2) = uVar2;
    if (*(int *)(in_RDI + 0x18) != 0) {
      dump_cur_dill_insn((dill_stream_conflict)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    }
    *(long *)(*(long *)(in_RDI + 8) + 8) = *(long *)(*(long *)(in_RDI + 8) + 8) + 6;
  }
  if (*(ulong *)(*(long *)(in_RDI + 8) + 0x10) <= *(ulong *)(*(long *)(in_RDI + 8) + 8)) {
    extend_dill_stream((dill_stream_conflict)CONCAT44(in_R9D,uVar3));
  }
  **(undefined1 **)(*(long *)(in_RDI + 8) + 8) = 0x90;
  if (*(int *)(in_RDI + 0x18) != 0) {
    dump_cur_dill_insn((dill_stream_conflict)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
  }
  *(long *)(*(long *)(in_RDI + 8) + 8) = *(long *)(*(long *)(in_RDI + 8) + 8) + 1;
  return;
}

Assistant:

extern void
x86_64_branch(dill_stream s, int op, int type, int src1, int src2, int label)
{
    int rex = 0;
    if ((type == DILL_L) || (type == DILL_UL) || (type == DILL_P))
        rex |= REX_W;

    switch (type) {
    case DILL_U:
    case DILL_UL:
    case DILL_US:
    case DILL_UC:
        op += 6; /* second set of codes */
                 /* fall through */
    default:
        if (src1 > RDI)
            rex |= REX_B;
        if (src2 > RDI)
            rex |= REX_R;
        if (type == DILL_D) {
            BYTE_OUT1R3(s, 0x66, rex, 0x0f, 0x2e, ModRM(0x3, src2, src1));
        } else if (type == DILL_F) {
            BYTE_OUT3R(s, rex, 0x0f, 0x2e, ModRM(0x3, src2, src1));
        } else {
            BYTE_OUT2R(s, rex, 0x39, ModRM(0x3, src2, src1));
        }
        dill_mark_branch_location(s, label);
        if ((type == DILL_D) || (type == DILL_F)) {
            BYTE_OUT2I(s, 0x0f, fop_conds[op], 0);
        } else {
            BYTE_OUT2I(s, 0x0f, op_conds[op], 0);
        }
    }
    x86_64_nop(s);
}